

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enc_sse2.c
# Opt level: O0

void TM4_SSE2(uint8_t *dst,uint8_t *top)

{
  long in_RSI;
  __m128i out;
  __m128i base;
  int val;
  int y;
  __m128i top_base;
  __m128i top_values;
  __m128i zero;
  int in_stack_fffffffffffffeac;
  undefined6 in_stack_fffffffffffffeb0;
  undefined2 local_120;
  undefined4 local_11c;
  
  WebPMemToInt32((uint8_t *)0x16c073);
  for (local_11c = 0; local_11c < 4; local_11c = local_11c + 1) {
    local_120 = (ushort)*(byte *)(in_RSI + (-2 - local_11c)) - (ushort)*(byte *)(in_RSI + -1);
    WebPInt32ToMem((uint8_t *)CONCAT26(local_120,in_stack_fffffffffffffeb0),
                   in_stack_fffffffffffffeac);
  }
  return;
}

Assistant:

static WEBP_INLINE void TM4_SSE2(uint8_t* WEBP_RESTRICT dst,
                                 const uint8_t* WEBP_RESTRICT top) {
  const __m128i zero = _mm_setzero_si128();
  const __m128i top_values = _mm_cvtsi32_si128(WebPMemToInt32(top));
  const __m128i top_base = _mm_unpacklo_epi8(top_values, zero);
  int y;
  for (y = 0; y < 4; ++y, dst += BPS) {
    const int val = top[-2 - y] - top[-1];
    const __m128i base = _mm_set1_epi16(val);
    const __m128i out = _mm_packus_epi16(_mm_add_epi16(base, top_base), zero);
    WebPInt32ToMem(dst, _mm_cvtsi128_si32(out));
  }
}